

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O3

MPP_RET store_picture_in_dpb(H264_DpbBuf_t *p_Dpb,H264_StorePic_t *p)

{
  H264dVideoCtx_t *p_Vid;
  H264_DpbMark_t *p_mark;
  h264_dec_ctx_t *phVar1;
  H264_DecCtx_t *p_Dec;
  h264_store_pic_t *phVar2;
  MPP_RET MVar3;
  RK_U32 RVar4;
  RK_S32 RVar5;
  h264_frame_store_t *phVar6;
  h264_store_pic_t *phVar7;
  int iVar8;
  char *pcVar9;
  char *fmt;
  H264_FrameStore_t *pHVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  H264_StorePic_t *p_00;
  uint uVar16;
  undefined8 uVar17;
  h264_drpm_t *phVar18;
  RK_S32 min_poc;
  undefined1 local_50 [28];
  RK_S32 local_34;
  
  p_Vid = p_Dpb->p_Vid;
  if (p == (H264_StorePic_t *)0x0) {
    MVar3 = MPP_ERR_VALUE;
    if (((byte)h264d_debug & 4) == 0) goto LAB_00192d1a;
    pcVar9 = "value error(%d).\n";
    uVar17 = 0x59d;
  }
  else {
    pcVar9 = (char *)p;
    if (p->mem_mark == (h264_dpb_mark_t *)0x0) {
LAB_00192c5b:
      if (((byte)h264d_debug & 1) != 0) {
        pcVar9 = "h264d_dpb";
        _mpp_log_l(4,"h264d_dpb","error, p->mem_mark == NULL",(char *)0x0);
      }
    }
    else {
      uVar16 = p->mem_mark->slot_idx;
      pcVar9 = (char *)(ulong)uVar16;
      if ((int)uVar16 < 0) goto LAB_00192c5b;
      mpp_buf_slot_set_flag(p_Vid->p_Dec->frame_slots,uVar16,SLOT_CODEC_USE);
    }
    p_Vid->last_has_mmco_5 = 0;
    p_Vid->last_pic_bottom_field = (uint)(p->structure == 2);
    if (p->idr_flag == 0) {
      if ((p->used_for_reference != 0) && (p->adaptive_ref_pic_buffering_flag != 0)) {
        local_50._8_8_ = p_Dpb->p_Vid;
        ((h264d_video_ctx_t *)local_50._8_8_)->last_has_mmco_5 = 0;
        phVar18 = p->dec_ref_pic_marking_buffer;
        if (phVar18 != (h264_drpm_t *)0x0) {
          do {
            switch(phVar18->memory_management_control_operation) {
            case 0:
              if (phVar18->Next != (h264_drpm_t *)0x0) {
                MVar3 = MPP_ERR_VALUE;
                if (((byte)h264d_debug & 4) == 0) goto LAB_00193b1a;
                pcVar9 = "value error(%d).\n";
                uVar17 = 0x42d;
                goto LAB_00193b13;
              }
              break;
            case 1:
              RVar4 = p->frame_num * 2 + 1;
              if (p->structure == 3) {
                RVar4 = p->frame_num;
              }
              if ((ulong)p_Dpb->ref_frames_in_buffer != 0) {
                iVar13 = RVar4 + ~phVar18->difference_of_pic_nums_minus1;
                pcVar9 = (char *)p_Dpb->fs_ref;
                uVar12 = 0;
                do {
                  p_Dec = *(H264_DecCtx_t **)(&((h264_store_pic_t *)pcVar9)->structure + uVar12 * 2)
                  ;
                  uVar16 = *(uint *)((long)&p_Dec->mem + 4);
                  if (p->structure != 3) {
                    if ((((uVar16 & 1) == 0) || (((ulong)p_Dec->dpb_mark & 1) != 0)) ||
                       (*(int *)(*(long *)&p_Dec->next_state + 0x18) != iVar13)) {
                      if ((((uVar16 & 2) == 0) || (((ulong)p_Dec->dpb_mark & 2) != 0)) ||
                         (*(int *)(*(long *)&p_Dec->mvc_valid + 0x18) != iVar13)) goto LAB_0019301b;
                      *(undefined4 *)(*(long *)&p_Dec->mvc_valid + 0x2c) = 0;
                      *(uint *)((long)&p_Dec->mem + 4) = uVar16 & 1;
                    }
                    else {
                      *(undefined4 *)(*(long *)&p_Dec->next_state + 0x2c) = 0;
                      *(uint *)((long)&p_Dec->mem + 4) = uVar16 & 2;
                    }
                    if (*(int *)&p_Dec->mem == 3) {
                      *(undefined4 *)(*(long *)&p_Dec->spt_decode_mtds + 0x2c) = 0;
                    }
                    break;
                  }
                  if (((uVar16 == 3) && (*(int *)&p_Dec->dpb_mark == 0)) &&
                     (*(int *)(*(long *)&p_Dec->spt_decode_mtds + 0x18) == iVar13)) {
                    unmark_for_reference(p_Dec,(H264_FrameStore_t *)pcVar9);
                    break;
                  }
LAB_0019301b:
                  uVar12 = uVar12 + 1;
                } while (p_Dpb->ref_frames_in_buffer != uVar12);
              }
              update_ref_list(p_Dpb);
              break;
            case 2:
              uVar16 = p_Dpb->ltref_frames_in_buffer;
              if (uVar16 != 0) {
                iVar13 = phVar18->long_term_pic_num;
                uVar12 = 0;
                do {
                  pHVar10 = p_Dpb->fs_ltref[uVar12];
                  uVar15 = pHVar10->is_reference;
                  if (p->structure != 3) {
                    if ((uVar15 & 1) == 0) {
LAB_00192f1a:
                      if (((uVar15 & 2) == 0) ||
                         ((uVar14 = pHVar10->is_long_term, (uVar14 & 2) == 0 ||
                          (pcVar9 = (char *)pHVar10->bottom_field,
                          ((h264_store_pic_t *)pcVar9)->long_term_pic_num != iVar13))))
                      goto LAB_00192f34;
                      ((h264_store_pic_t *)pcVar9)->used_for_reference = 0;
                      ((h264_store_pic_t *)pcVar9)->is_long_term = '\0';
                      pHVar10->is_reference = uVar15 & 1;
                      pHVar10->is_long_term = uVar14 & 1;
                    }
                    else {
                      uVar14 = pHVar10->is_long_term;
                      pcVar9 = (char *)(ulong)uVar14;
                      if (((uVar14 & 1) == 0) ||
                         (phVar7 = pHVar10->top_field, phVar7->long_term_pic_num != iVar13))
                      goto LAB_00192f1a;
                      phVar7->used_for_reference = 0;
                      phVar7->is_long_term = '\0';
                      pHVar10->is_reference = uVar15 & 2;
                      pcVar9 = (char *)(ulong)(uVar14 & 2);
                      pHVar10->is_long_term = uVar14 & 2;
                    }
                    if (pHVar10->is_used == 3) {
                      phVar7 = pHVar10->frame;
                      phVar7->used_for_reference = 0;
                      phVar7->is_long_term = '\0';
                    }
                    break;
                  }
                  if (((uVar15 == 3) && (pHVar10->is_long_term == 3)) &&
                     (pHVar10->frame->long_term_pic_num == iVar13)) {
                    unmark_for_long_term_reference(pHVar10);
                    uVar16 = p_Dpb->ltref_frames_in_buffer;
                  }
LAB_00192f34:
                  uVar12 = uVar12 + 1;
                } while (uVar12 < uVar16);
              }
              update_ltref_list(p_Dpb);
              break;
            case 3:
              RVar4 = p->frame_num * 2 + 1;
              if (p->structure == 3) {
                RVar4 = p->frame_num;
              }
              uVar16 = phVar18->long_term_frame_idx;
              phVar7 = (h264_store_pic_t *)(ulong)uVar16;
              iVar13 = ~phVar18->difference_of_pic_nums_minus1 + RVar4;
              if (p->structure == 3) {
                unmark_long_term_frame_for_reference_by_frame_idx(p_Dpb,uVar16);
                pcVar9 = (char *)phVar7;
LAB_001931c7:
                if (p->structure == 1) {
                  uVar17._0_4_ = 0;
                  uVar17._4_4_ = 0;
                  iVar11 = 1;
LAB_00193249:
                  if ((ulong)p_Dpb->ref_frames_in_buffer != 0) {
                    pcVar9 = (char *)p_Dpb->fs_ref;
                    uVar12 = 0;
                    do {
                      phVar6 = *(h264_frame_store_t **)
                                (&((h264_store_pic_t *)pcVar9)->structure + uVar12 * 2);
                      if ((((phVar6->is_reference & 1U) != 0) &&
                          (phVar7 = phVar6->top_field, phVar7->is_long_term == '\0')) &&
                         (phVar7->pic_num == iVar13)) {
                        uVar15 = phVar6->is_long_term;
                        if (uVar15 == 0) {
                          uVar15 = 0;
                        }
                        else if ((phVar6->long_term_frame_idx != uVar16) &&
                                (((byte)h264d_debug & 4) != 0)) {
                          _mpp_log_l(4,"h264d_dpb",
                                     "assigning long_term_frame_idx different from other field.",
                                     (char *)0x0);
                          phVar6 = p_Dpb->fs_ref[uVar12];
                          phVar7 = phVar6->top_field;
                          uVar15 = phVar6->is_long_term;
                        }
                        phVar7->long_term_frame_idx = uVar16;
                        phVar6->long_term_frame_idx = uVar16;
                        uVar14 = iVar11 + uVar16 * 2;
                        pcVar9 = (char *)(ulong)uVar14;
                        phVar7->long_term_pic_num = uVar14;
                        phVar7->is_long_term = '\x01';
                        phVar6->is_long_term = uVar15 | 1;
                        if ((uVar15 | 1) == 3) {
                          phVar7 = phVar6->frame;
                          phVar7->is_long_term = '\x01';
                          phVar7->long_term_pic_num = uVar16;
                          phVar7->long_term_frame_idx = uVar16;
                        }
                        goto LAB_001932ce;
                      }
                      if ((((phVar6->is_reference & 2U) != 0) &&
                          (phVar7 = phVar6->bottom_field, phVar7->is_long_term == '\0')) &&
                         (phVar7->pic_num == iVar13)) {
                        uVar15 = phVar6->is_long_term;
                        if (uVar15 == 0) {
                          uVar15 = 0;
                        }
                        else if ((phVar6->long_term_frame_idx != uVar16) &&
                                (((byte)h264d_debug & 4) != 0)) {
                          local_50._16_8_ = uVar17;
                          _mpp_log_l(4,"h264d_dpb",
                                     "assigning long_term_frame_idx different from other field.",
                                     (char *)0x0);
                          phVar6 = p_Dpb->fs_ref[uVar12];
                          phVar7 = phVar6->bottom_field;
                          uVar15 = phVar6->is_long_term;
                          uVar17 = local_50._16_8_;
                        }
                        phVar7->long_term_frame_idx = uVar16;
                        phVar6->long_term_frame_idx = uVar16;
                        uVar14 = (int)uVar17 + uVar16 * 2;
                        pcVar9 = (char *)(ulong)uVar14;
                        phVar7->long_term_pic_num = uVar14;
                        phVar7->is_long_term = '\x01';
                        phVar6->is_long_term = uVar15 | 2;
                        if ((uVar15 | 2) == 3) {
                          phVar7 = phVar6->frame;
                          phVar7->is_long_term = '\x01';
                          phVar7->long_term_pic_num = uVar16;
                          phVar7->long_term_frame_idx = uVar16;
                        }
                        goto LAB_001932ce;
                      }
                      uVar12 = uVar12 + 1;
                    } while (p_Dpb->ref_frames_in_buffer != uVar12);
                  }
                  if (((byte)h264d_debug & 4) == 0) goto LAB_001932ce;
                  fmt = "reference field for long term marking not found.";
                }
                else {
                  if (p->structure != 3) {
                    uVar17._0_4_ = 1;
                    uVar17._4_4_ = 0;
                    iVar11 = 0;
                    goto LAB_00193249;
                  }
                  if ((h264_store_pic_t *)(ulong)p_Dpb->ref_frames_in_buffer !=
                      (h264_store_pic_t *)0x0) {
                    pcVar9 = (char *)0x0;
                    do {
                      phVar6 = p_Dpb->fs_ref[(long)pcVar9];
                      if (((phVar6->is_reference == 3) &&
                          (phVar7 = phVar6->frame, phVar7->is_long_term == '\0')) &&
                         (phVar7->pic_num == iVar13)) {
                        phVar7->long_term_frame_idx = uVar16;
                        phVar6->long_term_frame_idx = uVar16;
                        phVar7->long_term_pic_num = uVar16;
                        phVar7->is_long_term = '\x01';
                        phVar7 = phVar6->top_field;
                        if ((phVar7 != (h264_store_pic_t *)0x0) &&
                           (phVar2 = phVar6->bottom_field, phVar2 != (h264_store_pic_t *)0x0)) {
                          phVar2->long_term_frame_idx = uVar16;
                          phVar7->long_term_frame_idx = uVar16;
                          phVar7->long_term_pic_num = uVar16;
                          phVar2->long_term_pic_num = uVar16;
                          pcVar9 = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),1);
                          phVar2->is_long_term = '\x01';
                          phVar7->is_long_term = '\x01';
                        }
                        phVar6->is_long_term = 3;
                        goto LAB_001932ce;
                      }
                      pcVar9 = (char *)((long)&((h264_store_pic_t *)pcVar9)->structure + 1);
                    } while ((h264_store_pic_t *)(ulong)p_Dpb->ref_frames_in_buffer !=
                             (h264_store_pic_t *)pcVar9);
                  }
                  if (((byte)h264d_debug & 4) == 0) goto LAB_001932ce;
                  fmt = "reference frame for long term marking not found.";
                }
                pcVar9 = "h264d_dpb";
                _mpp_log_l(4,"h264d_dpb",fmt,(char *)0x0);
              }
              else {
                if ((ulong)p_Dpb->ref_frames_in_buffer != 0) {
                  uVar12 = 0;
                  do {
                    pcVar9 = (char *)p_Dpb->fs_ref[uVar12];
                    if (((((h264_store_pic_t *)pcVar9)->poc & 1U) != 0) &&
                       (((h264_store_pic_t *)pcVar9)->frame->pic_num == iVar13)) {
                      pcVar9 = (char *)0x1;
LAB_001931af:
                      unmark_long_term_field_for_reference_by_frame_idx
                                (p_Dpb,(RK_S32)pcVar9,uVar16,0,0,iVar13);
                      goto LAB_001931c7;
                    }
                    if (((((h264_store_pic_t *)pcVar9)->poc & 2U) != 0) &&
                       (pcVar9 = *(char **)&((h264_store_pic_t *)pcVar9)->slice_type,
                       ((h264_store_pic_t *)pcVar9)->pic_num == iVar13)) {
                      pcVar9 = (char *)0x2;
                      goto LAB_001931af;
                    }
                    uVar12 = uVar12 + 1;
                  } while (p_Dpb->ref_frames_in_buffer != uVar12);
                }
                if (((byte)h264d_debug & 4) != 0) {
                  pcVar9 = "h264d_dpb";
                  _mpp_log_l(4,"h264d_dpb","value error(%d).\n",(char *)0x0);
                }
              }
LAB_001932ce:
              update_ref_list(p_Dpb);
              goto LAB_001932d6;
            case 4:
              pcVar9 = (char *)(ulong)(uint)phVar18->max_long_term_frame_idx_plus1;
              mm_update_max_long_term_frame_idx(p_Dpb,phVar18->max_long_term_frame_idx_plus1);
LAB_001932d6:
              update_ltref_list(p_Dpb);
              break;
            case 5:
              if (p_Dpb->ref_frames_in_buffer != 0) {
                uVar12 = 0;
                do {
                  unmark_for_reference
                            ((H264_DecCtx_t *)p_Dpb->fs_ref[uVar12],(H264_FrameStore_t *)pcVar9);
                  uVar12 = uVar12 + 1;
                } while (uVar12 < p_Dpb->ref_frames_in_buffer);
              }
              update_ref_list(p_Dpb);
              pcVar9 = (char *)0x0;
              mm_update_max_long_term_frame_idx(p_Dpb,0);
              *(RK_S32 *)(local_50._8_8_ + 0xc48) = 1;
              break;
            case 6:
              if (phVar18->max_long_term_frame_idx_plus1 == 0) {
                phVar18->max_long_term_frame_idx_plus1 = p_Dpb->num_ref_frames;
              }
              uVar16 = phVar18->long_term_frame_idx;
              phVar7 = (h264_store_pic_t *)(ulong)uVar16;
              uVar15 = p->structure;
              pcVar9 = (char *)(ulong)uVar15;
              if (uVar15 == 3) {
                unmark_long_term_frame_for_reference_by_frame_idx(p_Dpb,uVar16);
                pcVar9 = (char *)phVar7;
              }
              else {
                unmark_long_term_field_for_reference_by_frame_idx
                          (p_Dpb,uVar15,uVar16,1,p->pic_num,0);
              }
              p->is_long_term = '\x01';
              p->long_term_frame_idx = uVar16;
              iVar13 = p_Dpb->num_ref_frames;
              if (iVar13 < 2) {
                iVar13 = 1;
              }
              if ((iVar13 < (int)(p_Dpb->ref_frames_in_buffer + p_Dpb->ltref_frames_in_buffer)) &&
                 (sliding_window_memory_management(p_Dpb), ((byte)h264d_debug & 4) != 0)) {
                pcVar9 = "h264d_dpb";
                _mpp_log_l(4,"h264d_dpb","Max number of reference frames exceeded",(char *)0x0);
              }
              break;
            default:
              MVar3 = MPP_NOK;
              goto LAB_00193b1a;
            }
            phVar18 = phVar18->Next;
            p->dec_ref_pic_marking_buffer = phVar18;
          } while (phVar18 != (h264_drpm_t *)0x0);
          if (*(RK_S32 *)(local_50._8_8_ + 0xc48) != 0) {
            p->frame_num = 0;
            p->pic_num = 0;
            iVar13 = p->structure;
            if (iVar13 == 3) {
              p->is_mmco_5 = '\x01';
              iVar13 = p->top_poc;
              p->top_poc_mmco5 = iVar13;
              iVar11 = p->bottom_poc;
              p->bot_poc_mmco5 = iVar11;
              uVar15 = iVar13 - p->poc;
              pcVar9 = (char *)(ulong)uVar15;
              uVar16 = iVar11 - p->poc;
              iVar8 = iVar11;
              if (iVar13 < iVar11) {
                iVar8 = iVar13;
              }
              p->poc_mmco5 = iVar8;
              p->top_poc = uVar15;
              p->bottom_poc = uVar16;
              if (iVar13 <= iVar11) {
                uVar16 = uVar15;
              }
              p->poc = uVar16;
              p->frame_poc = uVar16;
            }
            else if (iVar13 == 2) {
              p->is_mmco_5 = '\x01';
              p->bot_poc_mmco5 = p->bottom_poc;
              p->bottom_poc = 0;
              p->poc = 0;
            }
            else if (iVar13 == 1) {
              p->is_mmco_5 = '\x01';
              p->top_poc_mmco5 = p->top_poc;
              p->poc = 0;
              p->top_poc = 0;
            }
            if (p->layer_id == 0) {
              MVar3 = flush_dpb(*(h264_dpb_buf_t **)(local_50._8_8_ + 0xa30),(RK_S32)pcVar9);
              if (MVar3 < MPP_OK) {
                if (((byte)h264d_debug & 4) != 0) {
                  pcVar9 = "Function error(%d).\n";
                  uVar17 = 0x470;
                  goto LAB_00193b13;
                }
                goto LAB_00193b1a;
              }
            }
            else {
              MVar3 = flush_dpb(((h264_dpb_buf_t **)(local_50._8_8_ + 0xa30))[1],(RK_S32)pcVar9);
              if (MVar3 < MPP_OK) {
                if (((byte)h264d_debug & 4) != 0) {
                  pcVar9 = "Function error(%d).\n";
                  uVar17 = 0x472;
LAB_00193b13:
                  _mpp_log_l(4,"h264d_dpb",pcVar9,(char *)0x0,uVar17);
                }
LAB_00193b1a:
                if (((byte)h264d_debug & 4) == 0) goto LAB_00192d1a;
                pcVar9 = "Function error(%d).\n";
                uVar17 = 0x5ab;
                goto LAB_00192d13;
              }
            }
          }
        }
      }
    }
    else {
      MVar3 = idr_memory_management(p_Dpb,p);
      if (MVar3 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) goto LAB_00192d1a;
        pcVar9 = "Function error(%d).\n";
        uVar17 = 0x5a8;
        goto LAB_00192d13;
      }
    }
    RVar4 = get_field_dpb_combine_flag(p_Dpb->last_picture,p);
    if (RVar4 == 0) {
      if (((p->idr_flag == 0) && (p->used_for_reference != 0)) &&
         (p->adaptive_ref_pic_buffering_flag == 0)) {
        sliding_window_memory_management(p_Dpb);
        p->is_long_term = '\0';
      }
      do {
        MVar3 = remove_unused_frame_from_dpb(p_Dpb);
      } while (MVar3 == MPP_OK);
      if ((h264d_debug._1_1_ & 1) != 0) {
        _mpp_log_l(4,"h264d_dpb","before out, dpb[%d] used_size %d, size %d",(char *)0x0,
                   (ulong)(uint)p_Dpb->layer_id,(ulong)p_Dpb->used_size,p_Dpb->size);
      }
      uVar16 = p_Vid->p_Inp->max_buf_size;
      if ((uVar16 != 0) && ((h264d_debug._1_1_ & 1) != 0)) {
        _mpp_log_l(4,"h264d_dpb","max_buf_size=%d\n",(char *)0x0,(ulong)uVar16);
      }
      uVar15 = p_Dpb->size;
      uVar14 = p_Dpb->used_size;
      if (uVar16 - 1 < uVar14 || uVar15 <= uVar14) {
        do {
          local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
          remove_unused_frame_from_dpb(p_Dpb);
          pHVar10 = (H264_FrameStore_t *)local_50;
          RVar5 = get_smallest_poc(p_Dpb,(RK_S32 *)local_50,&local_34);
          if (p->used_for_reference == 0) {
            if ((RVar5 != 0) && (iVar13 = p->poc, (int)local_50._0_4_ <= iVar13)) goto LAB_001937b3;
            MVar3 = direct_output(p_Vid,p_Dpb,p);
            if (MPP_NOK < MVar3) {
              return MPP_OK;
            }
            uVar17 = 0x5d1;
            if (((byte)h264d_debug & 4) == 0) goto LAB_00192d1a;
LAB_00193a9b:
            pcVar9 = "Function error(%d).\n";
            goto LAB_00192d13;
          }
          if (RVar5 == 0) {
LAB_001937b7:
            unmark_for_reference((H264_DecCtx_t *)*p_Dpb->fs,pHVar10);
            pHVar10 = *p_Dpb->fs;
            if (pHVar10->is_output == 0) {
              if (((byte)h264d_debug & 4) != 0) {
                _mpp_log_l(4,"h264d_dpb","write_stored_frame, line %d",(char *)0x0,0x5da);
                pHVar10 = *p_Dpb->fs;
              }
              MVar3 = write_stored_frame(p_Vid,p_Dpb,pHVar10);
              if (MVar3 < MPP_OK) {
                uVar17 = 0x5db;
                goto LAB_00193a86;
              }
            }
            MVar3 = remove_frame_from_dpb(p_Dpb,0);
            if (MVar3 < MPP_OK) {
              uVar17 = 0x5dd;
LAB_00193a86:
              if (((byte)h264d_debug & 4) != 0) goto LAB_00193a9b;
              goto LAB_00192d1a;
            }
            p->is_long_term = '\0';
          }
          else {
            iVar13 = p->poc;
LAB_001937b3:
            if (iVar13 < (int)local_50._0_4_) goto LAB_001937b7;
            MVar3 = output_one_frame_from_dpb(p_Dpb);
            if (MVar3 < MPP_OK) {
              uVar17 = 0x5e0;
              goto LAB_00193a86;
            }
          }
          uVar15 = p_Dpb->size;
          uVar14 = p_Dpb->used_size;
        } while (uVar16 - 1 < uVar14 || uVar15 <= uVar14);
      }
      uVar12 = (ulong)uVar14;
      if ((h264d_debug._1_1_ & 1) != 0) {
        _mpp_log_l(4,"h264d_dpb","after out, dpb[%d] used_size %d, size %d",(char *)0x0,
                   (ulong)(uint)p_Dpb->layer_id,uVar12,uVar15);
        uVar12 = (ulong)p_Dpb->used_size;
      }
      MVar3 = insert_picture_in_dpb(p_Vid,p_Dpb->fs[uVar12],p,'\0');
      if (MPP_NOK < MVar3) {
        if (p->structure == 3) {
          phVar6 = (h264_frame_store_t *)0x0;
        }
        else {
          phVar6 = p_Dpb->fs[p_Dpb->used_size];
        }
        p_Dpb->last_picture = phVar6;
        memcpy(&p_Vid->old_pic,p,0xe0);
        p_Vid->last_pic = &p_Vid->old_pic;
        p_Dpb->used_size = p_Dpb->used_size + 1;
        if ((h264d_debug._1_1_ & 1) != 0) {
          pcVar9 = "h264d_dpb";
          _mpp_log_l(4,"h264d_dpb","[DPB_size] p_Dpb->used_size=%d",(char *)0x0);
          p = (H264_StorePic_t *)pcVar9;
        }
        if (p_Vid->p_Dec->mvc_valid == '\0') {
          scan_dpb_output(p_Dpb,p);
        }
        update_ref_list(p_Dpb);
        update_ltref_list(p_Dpb);
        return MPP_OK;
      }
      if (((byte)h264d_debug & 4) == 0) goto LAB_00192d1a;
      pcVar9 = "Function error(%d).\n";
      uVar17 = 0x5e6;
    }
    else {
      p_00 = (H264_StorePic_t *)p_Dpb->last_picture;
      if (*(RK_U32 *)&p_00->top_field == 0) {
        MVar3 = insert_picture_in_dpb(p_Vid,(H264_FrameStore_t *)p_00,p,'\x01');
        if (MPP_NOK < MVar3) {
          scan_dpb_output(p_Dpb,p_00);
          goto LAB_001938e8;
        }
        if (((byte)h264d_debug & 4) == 0) goto LAB_00192d1a;
        pcVar9 = "Function error(%d).\n";
        uVar17 = 0x5b3;
      }
      else {
        MVar3 = direct_output(p_Vid,p_Dpb,p);
        if (MPP_NOK < MVar3) {
LAB_001938e8:
          memcpy(&p_Vid->old_pic,p,0xe0);
          p_Vid->last_pic = &p_Vid->old_pic;
          p_Dpb->last_picture = (h264_frame_store_t *)0x0;
          return MPP_OK;
        }
        if (((byte)h264d_debug & 4) == 0) goto LAB_00192d1a;
        pcVar9 = "Function error(%d).\n";
        uVar17 = 0x5b1;
      }
    }
  }
LAB_00192d13:
  _mpp_log_l(4,"h264d_dpb",pcVar9,(char *)0x0,uVar17);
LAB_00192d1a:
  p_mark = p->mem_mark;
  if (p_mark != (H264_DpbMark_t *)0x0) {
    if ((p_mark->out_flag == 0) || (p_mark->slot_idx < 0)) {
      if (((byte)h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_dpb","out_flag %d slot_idx %d\n",(char *)0x0,(ulong)p_mark->out_flag,
                   (ulong)(uint)p_mark->slot_idx);
      }
    }
    else {
      phVar1 = p_Vid->p_Dec;
      local_50._0_8_ = (MppFrame)0x0;
      mpp_buf_slot_get_prop(phVar1->frame_slots,p_mark->slot_idx,SLOT_FRAME_PTR,local_50);
      if ((MppFrame)local_50._0_8_ != (MppFrame)0x0) {
        if ((h264d_debug._1_1_ & 0x20) != 0) {
          _mpp_log_l(4,"h264d_dpb","[DPB_BUF_FLUSH] slot_idx=%d, top_used=%d, bot_used=%d",
                     (char *)0x0,(ulong)(uint)p_mark->slot_idx,(ulong)p_mark->top_used,
                     (uint)p_mark->bot_used);
        }
        mpp_frame_set_discard((MppFrame)local_50._0_8_,1);
        mpp_buf_slot_set_flag(phVar1->frame_slots,p_mark->slot_idx,SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(phVar1->frame_slots,p_mark->slot_idx,QUEUE_DISPLAY);
        mpp_buf_slot_clr_flag(phVar1->frame_slots,p_mark->slot_idx,SLOT_CODEC_USE);
        phVar1->last_frame_slot_idx = p_mark->slot_idx;
      }
      reset_dpb_mark(p_mark);
    }
  }
  return MVar3;
}

Assistant:

MPP_RET store_picture_in_dpb(H264_DpbBuf_t *p_Dpb, H264_StorePic_t *p)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;
    RK_U32 max_buf_size = 0;

    VAL_CHECK(ret, NULL != p);  //!< if frame, check for new store
    //!< set use flag
    if (p->mem_mark && (p->mem_mark->slot_idx >= 0)) {
        mpp_buf_slot_set_flag(p_Vid->p_Dec->frame_slots, p->mem_mark->slot_idx, SLOT_CODEC_USE);
    } else {
        H264D_ERR("error, p->mem_mark == NULL");
    }
    //!< deal with all frames in dpb
    p_Vid->last_has_mmco_5 = 0;
    p_Vid->last_pic_bottom_field = p->structure == BOTTOM_FIELD;
    if (p->idr_flag) {
        FUN_CHECK(ret = idr_memory_management(p_Dpb, p));
    } else {    //!< adaptive memory management
        if (p->used_for_reference && p->adaptive_ref_pic_buffering_flag) {
            FUN_CHECK(ret = adaptive_memory_management(p_Dpb, p));
        }
    }
    //!< if necessary, combine top and botteom to frame
    if (get_field_dpb_combine_flag(p_Dpb->last_picture, p)) {
        if (p_Dpb->last_picture->is_directout) {
            FUN_CHECK(ret = direct_output(p_Vid, p_Dpb, p));  //!< output frame
        } else {
            FUN_CHECK(ret = insert_picture_in_dpb(p_Vid, p_Dpb->last_picture, p, 1));  //!< field_dpb_combine
            scan_dpb_output(p_Dpb, p);
        }
        memcpy(&p_Vid->old_pic, p, sizeof(H264_StorePic_t));
        p_Vid->last_pic = &p_Vid->old_pic;
        p_Dpb->last_picture = NULL;
        goto __RETURN;
    }
    //!< sliding window
    if (!p->idr_flag && p->used_for_reference && !p->adaptive_ref_pic_buffering_flag) {
        ASSERT(!p->idr_flag);
        sliding_window_memory_management(p_Dpb);
        p->is_long_term = 0;
    }
    while (!remove_unused_frame_from_dpb(p_Dpb));
    H264D_DBG(H264D_DBG_DPB_INFO, "before out, dpb[%d] used_size %d, size %d",
              p_Dpb->layer_id, p_Dpb->used_size, p_Dpb->size);
    //!< when full output one frame or more then setting max_buf_size
    max_buf_size = p_Vid->p_Inp->max_buf_size;
    if (max_buf_size)
        H264D_DBG(H264D_DBG_DPB_INFO, "max_buf_size=%d\n", max_buf_size);
    while (p_Dpb->used_size >= p_Dpb->size ||
           (max_buf_size && p_Dpb->used_size >= max_buf_size)) {
        RK_S32 min_poc = 0, min_pos = 0;
        RK_S32 find_flag = 0;

        remove_unused_frame_from_dpb(p_Dpb);
        find_flag = get_smallest_poc(p_Dpb, &min_poc, &min_pos);
        if (!p->used_for_reference) {
            if ((!find_flag) || (p->poc < min_poc)) {
                FUN_CHECK(ret = direct_output(p_Vid, p_Dpb, p));  //!< output frame
                goto __RETURN;
            }
        }
        //!< used for reference, but not find, then flush a frame in the first
        if ((!find_flag) || (p->poc < min_poc)) {
            min_pos = 0;
            unmark_for_reference(p_Vid->p_Dec, p_Dpb->fs[min_pos]);
            if (!p_Dpb->fs[min_pos]->is_output) {
                H264D_WARNNING("write_stored_frame, line %d", __LINE__);
                FUN_CHECK(ret = write_stored_frame(p_Vid, p_Dpb, p_Dpb->fs[min_pos]));
            }
            FUN_CHECK(ret = remove_frame_from_dpb(p_Dpb, min_pos));
            p->is_long_term = 0;
        } else {
            FUN_CHECK(ret = output_one_frame_from_dpb(p_Dpb));
        }
    }
    H264D_DBG(H264D_DBG_DPB_INFO, "after out, dpb[%d] used_size %d, size %d",
              p_Dpb->layer_id, p_Dpb->used_size, p_Dpb->size);
    //!< store current decoder picture at end of dpb
    FUN_CHECK(ret = insert_picture_in_dpb(p_Vid, p_Dpb->fs[p_Dpb->used_size], p, 0));
    if (p->structure != FRAME) {
        p_Dpb->last_picture = p_Dpb->fs[p_Dpb->used_size];
    } else {
        p_Dpb->last_picture = NULL;
    }
    memcpy(&p_Vid->old_pic, p, sizeof(H264_StorePic_t));
    p_Vid->last_pic = &p_Vid->old_pic;

    p_Dpb->used_size++;
    H264D_DBG(H264D_DBG_DPB_INFO, "[DPB_size] p_Dpb->used_size=%d", p_Dpb->used_size);
    if (!p_Vid->p_Dec->mvc_valid)
        scan_dpb_output(p_Dpb, p);
    update_ref_list(p_Dpb);
    update_ltref_list(p_Dpb);

__RETURN:
    return ret = MPP_OK;
__FAILED:
    flush_one_dpb_mark(p_Vid->p_Dec, p->mem_mark);
    return ret;
}